

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  path *this_00;
  const_iterator cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  path *element;
  int iVar5;
  iterator __begin2;
  undefined1 local_1f8 [72];
  iterator local_1b0;
  const_iterator a;
  iterator __end2;
  const_iterator b;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  root_name((path *)local_1f8,this);
  root_name((path *)&a,base);
  bVar2 = filesystem::operator!=((path *)local_1f8,(path *)&a);
  if (!bVar2) {
    bVar2 = has_root_directory(this);
    bVar3 = has_root_directory(base);
    if (bVar2 == bVar3) {
      bVar2 = has_root_directory(this);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&a);
        std::__cxx11::string::~string((string *)local_1f8);
      }
      else {
        bVar2 = has_root_directory(base);
        std::__cxx11::string::~string((string *)&a);
        std::__cxx11::string::~string((string *)local_1f8);
        if (bVar2) goto LAB_001912a5;
      }
      begin(&a,this);
      begin(&b,base);
      while (end((iterator *)local_1f8,this), a._iter._M_current != (char *)local_1f8._32_8_) {
        end(&__begin2,base);
        if (b._iter._M_current == __begin2._iter._M_current) {
          std::__cxx11::string::~string((string *)&__begin2._current);
          break;
        }
        bVar2 = filesystem::operator==(&a._current,&b._current);
        std::__cxx11::string::~string((string *)&__begin2._current);
        std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
        if (!bVar2) goto LAB_001913e7;
        iterator::operator++(&a);
        iterator::operator++(&b);
      }
      std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
LAB_001913e7:
      end((iterator *)local_1f8,this);
      if (a._iter._M_current == (char *)local_1f8._32_8_) {
        end(&__begin2,base);
        cVar1 = __begin2._iter;
        std::__cxx11::string::~string((string *)&__begin2._current);
        std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
        if (b._iter._M_current == cVar1._M_current) {
          path<char[2],ghc::filesystem::path>
                    (__return_storage_ptr__,(char (*) [2])0x1f2f52,auto_format);
          goto LAB_001916c5;
        }
      }
      else {
        std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
      }
      end(&__begin2,base);
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1f8,&b,&__begin2);
      std::__cxx11::string::~string((string *)&__begin2._current);
      iterator::iterator(&__begin2,(iterator *)local_1f8);
      iterator::iterator(&__end2,&local_1b0);
      iVar5 = 0;
      this_00 = &__begin2._current;
      while (__begin2._iter._M_current != __end2._iter._M_current) {
        path<char[2],ghc::filesystem::path>((path *)local_70,(char (*) [2])0x1f2f52,auto_format);
        bVar2 = filesystem::operator!=(this_00,(path *)local_70);
        if (bVar2) {
          path<char[1],ghc::filesystem::path>((path *)local_90,(char (*) [1])0x1f1e68,auto_format);
          bVar2 = filesystem::operator!=(this_00,(path *)local_90);
          if (!bVar2) {
            std::__cxx11::string::~string(local_90);
            goto LAB_00191573;
          }
          path<char[3],ghc::filesystem::path>((path *)local_50,(char (*) [3])"..",auto_format);
          bVar2 = filesystem::operator!=(this_00,(path *)local_50);
          std::__cxx11::string::~string(local_50);
          std::__cxx11::string::~string(local_90);
          std::__cxx11::string::~string(local_70);
          iVar4 = 1;
          if (!bVar2) goto LAB_0019157b;
        }
        else {
LAB_00191573:
          std::__cxx11::string::~string(local_70);
LAB_0019157b:
          path<char[3],ghc::filesystem::path>((path *)local_70,(char (*) [3])"..",auto_format);
          bVar2 = filesystem::operator==(this_00,(path *)local_70);
          std::__cxx11::string::~string(local_70);
          iVar4 = -(uint)bVar2;
        }
        iVar5 = iVar5 + iVar4;
        iterator::operator++(&__begin2);
      }
      std::__cxx11::string::~string((string *)&__end2._current);
      std::__cxx11::string::~string((string *)this_00);
      input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1f8);
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
      if (-1 < iVar5) {
        while (bVar2 = iVar5 != 0, iVar5 = iVar5 + -1, bVar2) {
          append<char[3]>(__return_storage_ptr__,(char (*) [3])"..");
        }
        end(&__begin2,this);
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1f8,&a,&__begin2);
        std::__cxx11::string::~string((string *)&__begin2._current);
        iterator::iterator(&__begin2,(iterator *)local_1f8);
        iterator::iterator(&__end2,&local_1b0);
        while (__begin2._iter._M_current != __end2._iter._M_current) {
          operator/=(__return_storage_ptr__,&__begin2._current);
          iterator::operator++(&__begin2);
        }
        std::__cxx11::string::~string((string *)&__end2._current);
        std::__cxx11::string::~string((string *)&__begin2._current);
        input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                  ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1f8);
      }
LAB_001916c5:
      std::__cxx11::string::~string((string *)&b._current);
      std::__cxx11::string::~string((string *)&a._current);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)local_1f8);
LAB_001912a5:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}